

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::
SubscriptionSyncTest_test_encode_with_controls_version1_controls_are_omitted_Test::TestBody
          (SubscriptionSyncTest_test_encode_with_controls_version1_controls_are_omitted_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_b8;
  ByteBuffer buffer;
  SubscriptionSync subscription_sync;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_b8,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)subject_list);
  bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync
            (&subscription_sync,0x7b,&local_b8);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_b8);
  bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)&subscription_sync,REFRESH);
  bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)&subscription_sync,TOGGLE);
  bidfx_public_api::price::pixie::SubscriptionSync::Encode((int)&buffer);
  s_abi_cxx11_(&local_d8,"S",0x44);
  bidfx_public_api::tools::BufferUtil::BufferAsString_abi_cxx11_((ByteBuffer *)&local_f8);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"S\\000\\173\\002\\004\\011Quantity\\0102500000\\007Symbol\\007EURGBP\\004\\011Quantity\\0105600000\\007Symbol\\007USDJPY\"s"
             ,"BufferUtil::BufferAsString(buffer)",&local_d8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
               ,0xa4,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&buffer);
  SubscriptionSync::~SubscriptionSync(&subscription_sync);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_encode_with_controls_version1_controls_are_omitted)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);
    subscription_sync.AddControl(0, ControlOperationEnum::REFRESH);
    subscription_sync.AddControl(1, ControlOperationEnum::TOGGLE);

    ByteBuffer buffer = subscription_sync.Encode(PixieVersion::VERSION1);
    ASSERT_EQ("S\000\173\002\004\011Quantity\0102500000\007Symbol\007EURGBP\004\011Quantity\0105600000\007Symbol\007USDJPY"s, BufferUtil::BufferAsString(buffer));
}